

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O2

void __thiscall
kratos::PassManager::register_pass
          (PassManager *this,string *name,function<void_(kratos::Generator_*)> *fn)

{
  bool bVar1;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view format_str;
  format_args args;
  string local_58;
  pointer local_38;
  size_type sStack_30;
  
  bVar1 = has_pass(this,name);
  if (!bVar1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::function<void(kratos::Generator*)>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(kratos::Generator*)>>>>
                *)this,name,fn);
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_38 = (name->_M_dataplus)._M_p;
  sStack_30 = name->_M_string_length;
  bVar2 = fmt::v7::to_string_view<char,_0>("{0} already exists in the pass manager");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  fmt::v7::detail::vformat_abi_cxx11_(&local_58,(detail *)bVar2.data_,format_str,args);
  UserException::UserException(this_00,&local_58);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void PassManager::register_pass(const std::string& name, std::function<void(Generator*)> fn) {
    if (has_pass(name))
        throw UserException(::format("{0} already exists in the pass manager", name));
    passes_.emplace(name, std::move(fn));
}